

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.h
# Opt level: O2

mecab_learner_node_t * __thiscall
MeCab::FreeList<mecab_learner_node_t>::alloc(FreeList<mecab_learner_node_t> *this)

{
  undefined1 auVar1 [16];
  long lVar2;
  ulong uVar3;
  long lVar4;
  mecab_learner_node_t *local_18;
  
  uVar3 = *(ulong *)(this + 0x20);
  lVar2 = *(long *)(this + 0x28);
  if (uVar3 == *(ulong *)(this + 0x30)) {
    lVar2 = lVar2 + 1;
    *(long *)(this + 0x28) = lVar2;
    *(undefined8 *)(this + 0x20) = 0;
    uVar3 = 0;
  }
  lVar4 = *(long *)(this + 8);
  if (lVar2 == *(long *)(this + 0x10) - lVar4 >> 3) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(this + 0x30);
    uVar3 = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x98),8) == 0) {
      uVar3 = SUB168(auVar1 * ZEXT816(0x98),0);
    }
    local_18 = (mecab_learner_node_t *)operator_new__(uVar3);
    std::vector<mecab_learner_node_t*,std::allocator<mecab_learner_node_t*>>::
    emplace_back<mecab_learner_node_t*>
              ((vector<mecab_learner_node_t*,std::allocator<mecab_learner_node_t*>> *)(this + 8),
               &local_18);
    lVar2 = *(long *)(this + 0x28);
    lVar4 = *(long *)(this + 8);
    uVar3 = *(ulong *)(this + 0x20);
  }
  lVar2 = *(long *)(lVar4 + lVar2 * 8);
  *(ulong *)(this + 0x20) = uVar3 + 1;
  return (mecab_learner_node_t *)(uVar3 * 0x98 + lVar2);
}

Assistant:

T* alloc() {
    if (pi_ == size) {
      li_++;
      pi_ = 0;
    }
    if (li_ == freeList.size()) freeList.push_back(new T[size]);
    return freeList[li_] + (pi_++);
  }